

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O1

void secp256k1_ecmult_gen(secp256k1_ecmult_gen_context *ctx,secp256k1_gej *r,secp256k1_scalar *gn)

{
  secp256k1_ge_storage (*paasVar1) [64] [16];
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  secp256k1_gej *psVar7;
  uint64_t uVar8;
  secp256k1_gej *psVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  secp256k1_ge add;
  secp256k1_scalar gnb;
  secp256k1_ge_storage local_f8;
  secp256k1_ge local_b8;
  secp256k1_scalar local_58;
  
  local_f8.x.n[0] = 0;
  local_f8.x.n[1] = 0;
  local_f8.x.n[2] = 0;
  local_f8.x.n[3] = 0;
  local_f8.y.n[0] = 0;
  local_f8.y.n[1] = 0;
  local_f8.y.n[2] = 0;
  local_f8.y.n[3] = 0;
  psVar7 = &ctx->initial;
  psVar9 = r;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    (psVar9->x).n[0] = (psVar7->x).n[0];
    psVar7 = (secp256k1_gej *)((psVar7->x).n + 1);
    psVar9 = (secp256k1_gej *)((psVar9->x).n + 1);
  }
  secp256k1_scalar_add(&local_58,gn,&ctx->blind);
  local_b8.infinity = 0;
  lVar2 = 0x38;
  uVar3 = 0;
  uVar5 = local_f8.y.n[1];
  uVar6 = local_f8.y.n[3];
  uVar8 = local_f8.x.n[0];
  uVar10 = local_f8.x.n[1];
  uVar11 = local_f8.x.n[3];
  uVar12 = local_f8.y.n[2];
  uVar13 = local_f8.y.n[0];
  uVar14 = local_f8.x.n[2];
  do {
    paasVar1 = ctx->prec;
    uVar4 = 0;
    do {
      if (((uint)(local_58.d[uVar3 >> 4 & 0xfffffff] >> ((char)uVar3 * '\x04' & 0x3fU)) & 0xf) << 6
          == uVar4) {
        uVar8 = *(uint64_t *)((long)paasVar1[-1][0x3f][0xf].x.n + uVar4 + lVar2 + 8);
        uVar10 = *(uint64_t *)((long)paasVar1[-1][0x3f][0xf].x.n + uVar4 + lVar2 + 0x10);
        uVar14 = *(uint64_t *)((long)paasVar1[-1][0x3f][0xf].x.n + uVar4 + lVar2 + 0x18);
        uVar11 = *(uint64_t *)((long)paasVar1[-1][0x3f][0xf].y.n + uVar4 + lVar2);
        uVar13 = *(uint64_t *)((long)paasVar1[-1][0x3f][0xf].y.n + uVar4 + lVar2 + 8);
        uVar5 = *(uint64_t *)((long)paasVar1[-1][0x3f][0xf].y.n + uVar4 + lVar2 + 0x10);
        uVar12 = *(uint64_t *)((long)paasVar1[-1][0x3f][0xf].y.n + uVar4 + lVar2 + 0x18);
        uVar6 = *(uint64_t *)((long)(*paasVar1)[0][0].x.n + uVar4 + lVar2);
      }
      uVar4 = uVar4 + 0x40;
    } while (uVar4 != 0x400);
    local_f8.x.n[0] = uVar8;
    local_f8.x.n[1] = uVar10;
    local_f8.x.n[2] = uVar14;
    local_f8.x.n[3] = uVar11;
    local_f8.y.n[0] = uVar13;
    local_f8.y.n[1] = uVar5;
    local_f8.y.n[2] = uVar12;
    local_f8.y.n[3] = uVar6;
    secp256k1_ge_from_storage(&local_b8,&local_f8);
    secp256k1_gej_add_ge(r,r,&local_b8);
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x400;
  } while (uVar3 != 0x40);
  return;
}

Assistant:

static void secp256k1_ecmult_gen(const secp256k1_ecmult_gen_context *ctx, secp256k1_gej *r, const secp256k1_scalar *gn) {
    secp256k1_ge add;
    secp256k1_ge_storage adds;
    secp256k1_scalar gnb;
    int bits;
    int i, j;
    memset(&adds, 0, sizeof(adds));
    *r = ctx->initial;
    /* Blind scalar/point multiplication by computing (n-b)G + bG instead of nG. */
    secp256k1_scalar_add(&gnb, gn, &ctx->blind);
    add.infinity = 0;
    for (j = 0; j < ECMULT_GEN_PREC_N; j++) {
        bits = secp256k1_scalar_get_bits(&gnb, j * ECMULT_GEN_PREC_B, ECMULT_GEN_PREC_B);
        for (i = 0; i < ECMULT_GEN_PREC_G; i++) {
            /** This uses a conditional move to avoid any secret data in array indexes.
             *   _Any_ use of secret indexes has been demonstrated to result in timing
             *   sidechannels, even when the cache-line access patterns are uniform.
             *  See also:
             *   "A word of warning", CHES 2013 Rump Session, by Daniel J. Bernstein and Peter Schwabe
             *    (https://cryptojedi.org/peter/data/chesrump-20130822.pdf) and
             *   "Cache Attacks and Countermeasures: the Case of AES", RSA 2006,
             *    by Dag Arne Osvik, Adi Shamir, and Eran Tromer
             *    (http://www.tau.ac.il/~tromer/papers/cache.pdf)
             */
            secp256k1_ge_storage_cmov(&adds, &(*ctx->prec)[j][i], i == bits);
        }
        secp256k1_ge_from_storage(&add, &adds);
        secp256k1_gej_add_ge(r, r, &add);
    }
    bits = 0;
    secp256k1_ge_clear(&add);
    secp256k1_scalar_clear(&gnb);
}